

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  U32 stat;
  bool bVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  uint uVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,litLength);
  uVar5 = 0x800;
  if (((int)plVar4[0xc] != 2) && (uVar5 = 0x600, (int)plVar4[10] != 1)) {
    uVar5 = *(uint *)(plVar4 + 8);
    if (uVar5 < 0x100) {
      __assert_fail("optPtr->litSumBasePrice >= BITCOST_MULTIPLIER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x117,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    uVar1 = uVar5 - 0x100;
    bVar2 = true;
    while (bVar2) {
      stat = *(U32 *)(*plVar4 + (ulong)*literals * 4);
      if ((int)optPtr == 0) {
        uVar3 = ZSTD_bitWeight(stat);
      }
      else {
        uVar3 = ZSTD_fracWeight(stat);
      }
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar5 = uVar5 - uVar3;
      bVar2 = false;
    }
  }
  return uVar5;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}